

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void timeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  long lVar1;
  int iVar2;
  DateTime *in_RDX;
  undefined4 in_ESI;
  sqlite3_context *in_RDI;
  long in_FS_OFFSET;
  int n;
  int s;
  DateTime x;
  char zBuf [16];
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa8;
  sqlite3_value **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  double local_28;
  byte local_1c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memcpy(&stack0xffffffffffffffb8,&DAT_002af580,0x30);
  iVar2 = isDate((sqlite3_context *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,(DateTime *)in_RDI);
  if (iVar2 == 0) {
    computeHMS(in_RDX);
    if ((local_1c >> 2 & 1) == 0) {
      iVar2 = (int)local_28;
      uVar3 = 8;
    }
    else {
      iVar2 = (int)(local_28 * 1000.0 + 0.5);
      uVar3 = 0xc;
    }
    sqlite3_result_text(in_RDI,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffa8),
                        (int)((ulong)in_RDX >> 0x20),(_func_void_void_ptr *)CONCAT44(iVar2,uVar3));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void timeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  if( isDate(context, argc, argv, &x)==0 ){
    int s, n;
    char zBuf[16];
    computeHMS(&x);
    zBuf[0] = '0' + (x.h/10)%10;
    zBuf[1] = '0' + (x.h)%10;
    zBuf[2] = ':';
    zBuf[3] = '0' + (x.m/10)%10;
    zBuf[4] = '0' + (x.m)%10;
    zBuf[5] = ':';
    if( x.useSubsec ){
      s = (int)(1000.0*x.s + 0.5);
      zBuf[6] = '0' + (s/10000)%10;
      zBuf[7] = '0' + (s/1000)%10;
      zBuf[8] = '.';
      zBuf[9] = '0' + (s/100)%10;
      zBuf[10] = '0' + (s/10)%10;
      zBuf[11] = '0' + (s)%10;
      zBuf[12] = 0;
      n = 12;
    }else{
      s = (int)x.s;
      zBuf[6] = '0' + (s/10)%10;
      zBuf[7] = '0' + (s)%10;
      zBuf[8] = 0;
      n = 8;
    }
    sqlite3_result_text(context, zBuf, n, SQLITE_TRANSIENT);
  }
}